

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void rhash_sha224_init(sha256_ctx_conflict *ctx)

{
  sha256_ctx_conflict *ctx_local;
  
  ctx->length = 0;
  ctx->digest_length = 0x1c;
  ctx->hash[0] = 0xc1059ed8;
  ctx->hash[1] = 0x367cd507;
  ctx->hash[2] = 0x3070dd17;
  ctx->hash[3] = 0xf70e5939;
  ctx->hash[4] = 0xffc00b31;
  ctx->hash[5] = 0x68581511;
  ctx->hash[6] = 0x64f98fa7;
  ctx->hash[7] = 0xbefa4fa4;
  return;
}

Assistant:

void rhash_sha224_init(struct sha256_ctx* ctx)
{
	/* Initial values from FIPS 180-3. These words were obtained by taking
	 * bits from 33th to 64th of the fractional parts of the square
	 * roots of ninth through sixteenth prime numbers. */
	static const unsigned SHA224_H0[8] = {
		0xc1059ed8, 0x367cd507, 0x3070dd17, 0xf70e5939,
		0xffc00b31, 0x68581511, 0x64f98fa7, 0xbefa4fa4
	};

	ctx->length = 0;
	ctx->digest_length = sha224_hash_size;

	memcpy(ctx->hash, SHA224_H0, sizeof(ctx->hash));
}